

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::GenerateFieldDescription
          (FieldGenerator *this,Printer *printer,bool include_default)

{
  char *text;
  undefined7 in_register_00000011;
  
  text = 
  "{\n  .name = \"$name$\",\n  .dataTypeSpecific.$dataTypeSpecific_name$ = $dataTypeSpecific_value$,\n  .number = $field_number_name$,\n  .hasIndex = $has_index$,\n  .offset = $storage_offset_value$,$storage_offset_comment$\n  .flags = $fieldflags$,\n  .dataType = GPBDataType$field_type$,\n},\n"
  ;
  if ((int)CONCAT71(in_register_00000011,include_default) != 0) {
    text = 
    "{\n  .defaultValue.$default_name$ = $default$,\n  .core.name = \"$name$\",\n  .core.dataTypeSpecific.$dataTypeSpecific_name$ = $dataTypeSpecific_value$,\n  .core.number = $field_number_name$,\n  .core.hasIndex = $has_index$,\n  .core.offset = $storage_offset_value$,$storage_offset_comment$\n  .core.flags = $fieldflags$,\n  .core.dataType = GPBDataType$field_type$,\n},\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void FieldGenerator::GenerateFieldDescription(
    io::Printer* printer, bool include_default) const {
  // Printed in the same order as the structure decl.
  if (include_default) {
    printer->Print(
        variables_,
        "{\n"
        "  .defaultValue.$default_name$ = $default$,\n"
        "  .core.name = \"$name$\",\n"
        "  .core.dataTypeSpecific.$dataTypeSpecific_name$ = $dataTypeSpecific_value$,\n"
        "  .core.number = $field_number_name$,\n"
        "  .core.hasIndex = $has_index$,\n"
        "  .core.offset = $storage_offset_value$,$storage_offset_comment$\n"
        "  .core.flags = $fieldflags$,\n"
        "  .core.dataType = GPBDataType$field_type$,\n"
        "},\n");
  } else {
    printer->Print(
        variables_,
        "{\n"
        "  .name = \"$name$\",\n"
        "  .dataTypeSpecific.$dataTypeSpecific_name$ = $dataTypeSpecific_value$,\n"
        "  .number = $field_number_name$,\n"
        "  .hasIndex = $has_index$,\n"
        "  .offset = $storage_offset_value$,$storage_offset_comment$\n"
        "  .flags = $fieldflags$,\n"
        "  .dataType = GPBDataType$field_type$,\n"
        "},\n");
  }
}